

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

var cs_impl::runtime_cs_ext::wait_worker(callable *func,vector *args)

{
  if ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)args[1].super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>._M_impl.
              super__Vector_impl_data._M_start)(func);
    return (var)(proxy *)func;
  }
  std::__throw_bad_function_call();
}

Assistant:

var wait_worker(const cs::callable &func, cs::vector &args)
		{
			try {
				return func.call(args);
			}
			catch (const lang_error &le) {
				std::cerr << "wait thread terminated after throwing an instance of runtime exception" << std::endl;
				std::cerr << "what(): " << le.what() << std::endl;
			}
			catch (const std::exception &e) {
				std::cerr << "wait thread terminated after throwing an instance of exception" << std::endl;
				std::cerr << "what(): " << e.what() << std::endl;
			}
			catch (...) {
				std::cerr << "wait thread terminated after throwing an instance of unknown exception" << std::endl;
			}
			return null_pointer;
		}